

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall duckdb::BaseAppender::AppendValueInternal<bool>(BaseAppender *this,bool input)

{
  PhysicalType PVar1;
  ulong __n;
  data_ptr_t pdVar2;
  long lVar3;
  reference col;
  InvalidInputException *this_00;
  InternalException *this_01;
  vector<duckdb::LogicalType,_true> *pvVar4;
  string_t sVar5;
  allocator local_59;
  Value local_58;
  
  __n = this->column;
  pvVar4 = &this->active_types;
  if ((this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar4 = &this->types;
  }
  lVar3 = (long)(pvVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (__n < (ulong)(lVar3 / 0x18)) {
    col = vector<duckdb::Vector,_true>::get<true>(&(this->chunk).data,__n);
    switch((col->type).id_) {
    case BOOLEAN:
      AppendValueInternal<bool,bool>(this,col,input);
      break;
    case TINYINT:
      AppendValueInternal<bool,signed_char>(this,col,input);
      break;
    case SMALLINT:
      AppendValueInternal<bool,short>(this,col,input);
      break;
    case INTEGER:
      AppendValueInternal<bool,int>(this,col,input);
      break;
    case BIGINT:
      AppendValueInternal<bool,long>(this,col,input);
      break;
    case DATE:
      AppendValueInternal<bool,duckdb::date_t>(this,col,input);
      break;
    case TIME:
      AppendValueInternal<bool,duckdb::dtime_t>(this,col,input);
      break;
    default:
      Value::CreateValue<bool>(&local_58,input);
      AppendValue(this,&local_58);
      Value::~Value(&local_58);
      return;
    case TIMESTAMP:
    case TIMESTAMP_TZ:
      AppendValueInternal<bool,duckdb::timestamp_t>(this,col,input);
      break;
    case DECIMAL:
      PVar1 = (col->type).physical_type_;
      if (PVar1 == INT128) {
        AppendDecimalValueInternal<bool,duckdb::hugeint_t>(this,col,input);
      }
      else if (PVar1 == INT32) {
        AppendDecimalValueInternal<bool,int>(this,col,input);
      }
      else if (PVar1 == INT64) {
        AppendDecimalValueInternal<bool,long>(this,col,input);
      }
      else {
        if (PVar1 != INT16) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_58,"Internal type not recognized for Decimal",&local_59);
          InternalException::InternalException(this_01,(string *)&local_58);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        AppendDecimalValueInternal<bool,short>(this,col,input);
      }
      break;
    case FLOAT:
      AppendValueInternal<bool,float>(this,col,input);
      break;
    case DOUBLE:
      AppendValueInternal<bool,double>(this,col,input);
      break;
    case VARCHAR:
      sVar5 = StringCast::Operation<bool>(input,col);
      pdVar2 = col->data;
      lVar3 = (this->chunk).count * 0x10;
      *(long *)(pdVar2 + lVar3) = sVar5.value._0_8_;
      *(long *)(pdVar2 + lVar3 + 8) = sVar5.value._8_8_;
      break;
    case INTERVAL:
      AppendValueInternal<bool,duckdb::interval_t>(this,col,input);
      break;
    case UTINYINT:
      AppendValueInternal<bool,unsigned_char>(this,col,input);
      break;
    case USMALLINT:
      AppendValueInternal<bool,unsigned_short>(this,col,input);
      break;
    case UINTEGER:
      AppendValueInternal<bool,unsigned_int>(this,col,input);
      break;
    case UBIGINT:
      AppendValueInternal<bool,unsigned_long>(this,col,input);
      break;
    case TIME_TZ:
      AppendValueInternal<bool,duckdb::dtime_tz_t>(this,col,input);
      break;
    case UHUGEINT:
      AppendValueInternal<bool,duckdb::uhugeint_t>(this,col,input);
      break;
    case HUGEINT:
      AppendValueInternal<bool,duckdb::hugeint_t>(this,col,input);
    }
    this->column = this->column + 1;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10,__n,lVar3 % 0x18);
  ::std::__cxx11::string::string((string *)&local_58,"Too many appends for chunk!",&local_59);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_58);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(T input) {
	if (column >= GetActiveTypes().size()) {
		throw InvalidInputException("Too many appends for chunk!");
	}
	auto &col = chunk.data[column];
	switch (col.GetType().id()) {
	case LogicalTypeId::BOOLEAN:
		AppendValueInternal<T, bool>(col, input);
		break;
	case LogicalTypeId::UTINYINT:
		AppendValueInternal<T, uint8_t>(col, input);
		break;
	case LogicalTypeId::TINYINT:
		AppendValueInternal<T, int8_t>(col, input);
		break;
	case LogicalTypeId::USMALLINT:
		AppendValueInternal<T, uint16_t>(col, input);
		break;
	case LogicalTypeId::SMALLINT:
		AppendValueInternal<T, int16_t>(col, input);
		break;
	case LogicalTypeId::UINTEGER:
		AppendValueInternal<T, uint32_t>(col, input);
		break;
	case LogicalTypeId::INTEGER:
		AppendValueInternal<T, int32_t>(col, input);
		break;
	case LogicalTypeId::UBIGINT:
		AppendValueInternal<T, uint64_t>(col, input);
		break;
	case LogicalTypeId::BIGINT:
		AppendValueInternal<T, int64_t>(col, input);
		break;
	case LogicalTypeId::HUGEINT:
		AppendValueInternal<T, hugeint_t>(col, input);
		break;
	case LogicalTypeId::UHUGEINT:
		AppendValueInternal<T, uhugeint_t>(col, input);
		break;
	case LogicalTypeId::FLOAT:
		AppendValueInternal<T, float>(col, input);
		break;
	case LogicalTypeId::DOUBLE:
		AppendValueInternal<T, double>(col, input);
		break;
	case LogicalTypeId::DECIMAL:
		switch (col.GetType().InternalType()) {
		case PhysicalType::INT16:
			AppendDecimalValueInternal<T, int16_t>(col, input);
			break;
		case PhysicalType::INT32:
			AppendDecimalValueInternal<T, int32_t>(col, input);
			break;
		case PhysicalType::INT64:
			AppendDecimalValueInternal<T, int64_t>(col, input);
			break;
		case PhysicalType::INT128:
			AppendDecimalValueInternal<T, hugeint_t>(col, input);
			break;
		default:
			throw InternalException("Internal type not recognized for Decimal");
		}
		break;
	case LogicalTypeId::DATE:
		AppendValueInternal<T, date_t>(col, input);
		break;
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		AppendValueInternal<T, timestamp_t>(col, input);
		break;
	case LogicalTypeId::TIME:
		AppendValueInternal<T, dtime_t>(col, input);
		break;
	case LogicalTypeId::TIME_TZ:
		AppendValueInternal<T, dtime_tz_t>(col, input);
		break;
	case LogicalTypeId::INTERVAL:
		AppendValueInternal<T, interval_t>(col, input);
		break;
	case LogicalTypeId::VARCHAR:
		FlatVector::GetData<string_t>(col)[chunk.size()] = StringCast::Operation<T>(input, col);
		break;
	default:
		AppendValue(Value::CreateValue<T>(input));
		return;
	}
	column++;
}